

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O3

void MapOptHandler_redirect(FMapInfoParser *parse,level_info_t *info)

{
  int iVar1;
  
  if (parse->format_type == 2) {
    FScanner::MustGetStringName(&parse->sc,"=");
  }
  FScanner::MustGetString(&parse->sc);
  iVar1 = FName::NameManager::FindName(&FName::NameData,(parse->sc).String,false);
  (info->RedirectType).Index = iVar1;
  if (parse->format_type == 2) {
    FScanner::MustGetStringName(&parse->sc,",");
  }
  FMapInfoParser::ParseNextMap(parse,&info->RedirectMapName);
  return;
}

Assistant:

DEFINE_MAP_OPTION(redirect, true)
{
	parse.ParseAssign();
	parse.sc.MustGetString();
	info->RedirectType = parse.sc.String;
	parse.ParseComma();
	parse.ParseNextMap(info->RedirectMapName);
}